

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::TexSubImageCubeArrayBufferCase::createTexture
          (TexSubImageCubeArrayBufferCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  TextureFormatInfo *minVal;
  Vec4 *maxVal;
  int iVar1;
  int i_1;
  int iVar2;
  int iVar3;
  TransferFormat TVar4;
  int i;
  long lVar5;
  uint uVar6;
  int iVar7;
  deUint32 buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  Vec4 colorB;
  Vec4 cScale;
  Vector<float,_4> res_1;
  Vec4 colorA;
  Vec4 cBias;
  float local_40 [4];
  
  this_01 = &(this->super_TextureCubeArraySpecCase).m_texFormat;
  TVar4 = glu::getTransferFormat((this->super_TextureCubeArraySpecCase).m_texFormat);
  iVar2 = tcu::TextureFormat::getPixelSize(this_01);
  tex = 0;
  buf = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x9009,tex);
  iVar7 = (this->super_TextureCubeArraySpecCase).m_size;
  uVar6 = iVar7 * iVar2 + 3U & 0xfffffffc;
  iVar7 = iVar7 * uVar6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)((this->super_TextureCubeArraySpecCase).m_depth * iVar7));
  iVar3 = (this->super_TextureCubeArraySpecCase).m_size;
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&res_1,this_01,iVar3,iVar3,
             (this->super_TextureCubeArraySpecCase).m_depth,uVar6,iVar7,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  minVal = &(this->super_TextureCubeArraySpecCase).m_texFormatInfo;
  maxVal = &(this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMax;
  tcu::fillWithComponentGradients((PixelBufferAccess *)&res_1,&minVal->valueMin,maxVal);
  iVar7 = (this->super_TextureCubeArraySpecCase).m_size;
  sglr::ContextWrapper::glTexImage3D
            (this_00,0x9009,0,*(int *)&(this->super_TextureCubeArraySpecCase).field_0xd4,iVar7,iVar7
             ,(this->super_TextureCubeArraySpecCase).m_depth,0,TVar4.format,TVar4.dataType,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar7 = this->m_imageHeight;
  iVar3 = this->m_rowLength;
  if (iVar3 < 1) {
    iVar3 = this->m_subW;
  }
  iVar1 = this->m_alignment;
  if (iVar7 < 1) {
    iVar7 = this->m_subH;
  }
  cScale.m_data[0] = 0.0;
  cScale.m_data[1] = 0.0;
  cScale.m_data[2] = 0.0;
  cScale.m_data[3] = 0.0;
  lVar5 = 0;
  do {
    cScale.m_data[lVar5] =
         maxVal->m_data[lVar5] -
         (this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin.m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  uVar6 = iVar1 + -1 + iVar3 * iVar2 & -iVar1;
  cBias.m_data._0_8_ = *(undefined8 *)(minVal->valueMin).m_data;
  cBias.m_data._8_8_ =
       *(undefined8 *)((this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin.m_data + 2);
  colorB.m_data[0] = 1.0;
  colorB.m_data[1] = 0.0;
  colorB.m_data[2] = 0.0;
  colorB.m_data[3] = 1.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar5 = 0;
  do {
    res_1.m_data[lVar5] = colorB.m_data[lVar5] * cScale.m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  colorA.m_data[0] = 0.0;
  colorA.m_data[1] = 0.0;
  colorA.m_data[2] = 0.0;
  colorA.m_data[3] = 0.0;
  lVar5 = 0;
  do {
    colorA.m_data[lVar5] = res_1.m_data[lVar5] + cBias.m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_40[0] = 0.0;
  local_40[1] = 1.0;
  local_40[2] = 0.0;
  local_40[3] = 1.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar5 = 0;
  do {
    res_1.m_data[lVar5] = local_40[lVar5] * cScale.m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  colorB.m_data[0] = 0.0;
  colorB.m_data[1] = 0.0;
  colorB.m_data[2] = 0.0;
  colorB.m_data[3] = 0.0;
  lVar5 = 0;
  do {
    colorB.m_data[lVar5] = res_1.m_data[lVar5] + cBias.m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  iVar7 = iVar7 * uVar6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)((this->m_skipImages + (this->super_TextureCubeArraySpecCase).m_depth) *
                          iVar7 + this->m_offset));
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&res_1,this_01,this->m_subW,this->m_subH,this->m_subD,uVar6,iVar7,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)this->m_offset +
             (long)(this->m_skipPixels * iVar2) + (long)(int)(this->m_skipRows * uVar6) +
             (long)(this->m_skipImages * iVar7));
  tcu::fillWithGrid((PixelBufferAccess *)&res_1,4,&colorA,&colorB);
  sglr::ContextWrapper::glGenBuffers(this_00,1,&buf);
  sglr::ContextWrapper::glBindBuffer(this_00,0x88ec,buf);
  sglr::ContextWrapper::glBufferData
            (this_00,0x88ec,
             (long)((int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start),
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806e,this->m_imageHeight);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806d,this->m_skipImages);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  sglr::ContextWrapper::glTexSubImage3D
            (this_00,0x9009,0,this->m_subX,this->m_subY,this->m_subZ,this->m_subW,this->m_subH,
             this->m_subD,TVar4.format,TVar4.dataType,(void *)(long)this->m_offset);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);

		// Fill with gradient.
		{
			int		rowPitch		= deAlign32(pixelSize*m_size,  4);
			int		slicePitch		= rowPitch*m_size;

			data.resize(slicePitch*m_depth);
			tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_size, m_size, m_depth, rowPitch, slicePitch, &data[0]), m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
		}

		glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, m_internalFormat, m_size, m_size, m_depth, 0, transferFmt.format, transferFmt.dataType, &data[0]);

		// Fill data with grid.
		{
			int		rowLength		= m_rowLength > 0 ? m_rowLength : m_subW;
			int		rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
			int		imageHeight		= m_imageHeight > 0 ? m_imageHeight : m_subH;
			int		slicePitch		= imageHeight*rowPitch;
			Vec4	cScale			= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias			= m_texFormatInfo.valueMin;
			Vec4	colorA			= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB			= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			data.resize(slicePitch*(m_depth+m_skipImages) + m_offset);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, m_subD, rowPitch, slicePitch, &data[0] + m_skipImages*slicePitch + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER,	buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER,	(int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_IMAGE_HEIGHT,	m_imageHeight);
		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_IMAGES,	m_skipImages);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);
		glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, m_subX, m_subY, m_subZ, m_subW, m_subH, m_subD, transferFmt.format, transferFmt.dataType, (const void*)(deIntptr)m_offset);
	}